

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkFile tonk_file_receive(TonkFile file,void *data,uint32_t bytes,FpTonkFileDone fp,void *context)

{
  FpTonkFileDone in_RCX;
  uint32_t in_EDX;
  void *in_RSI;
  TonkFile in_RDI;
  void *in_R8;
  TonkFile local_8;
  
  if (fp_tonk_file_receive == (fp_tonk_file_receive_t)0x0) {
    local_8 = (TonkFile)0x0;
  }
  else {
    local_8 = (*fp_tonk_file_receive)(in_RDI,in_RSI,in_EDX,in_RCX,in_R8);
  }
  return local_8;
}

Assistant:

TonkFile tonk_file_receive(
    TonkFile     file,  ///< TonkFile to update (or null)
    const void*  data,  ///< Data received
    uint32_t    bytes,  ///< Bytes of data
    FpTonkFileDone fp,  ///< Callback function
    void*     context   ///< Context pointer
)
{
    if (!fp_tonk_file_receive) {
        return 0;
    }

    return fp_tonk_file_receive(
        file,
        data,
        bytes,
        fp,
        context);
}